

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

Object * flatbuffers::GetUnionType(Schema *schema,Object *parent,Field *unionfield,Table *table)

{
  byte key;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this;
  Type *pTVar1;
  char *pcVar2;
  return_type this_00;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *this_01;
  String *this_02;
  return_type field;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this_03;
  return_type this_04;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_05;
  return_type pOVar3;
  int __c;
  int __c_00;
  Object *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  __s = parent;
  this = reflection::Schema::enums(schema);
  pTVar1 = reflection::Field::type(unionfield);
  pcVar2 = reflection::Type::index(pTVar1,(char *)__s,__c);
  this_00 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(this,(uint)pcVar2);
  this_01 = reflection::Object::fields(parent);
  this_02 = reflection::Field::name(unionfield);
  String::str_abi_cxx11_(&local_50,this_02);
  std::operator+(&local_70,&local_50,"_type");
  field = Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::LookupByKey<char_const*>
                    ((Vector<flatbuffers::Offset<reflection::Field>,unsigned_int> *)this_01,
                     local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (field != (return_type)0x0) {
    key = GetFieldI<unsigned_char>(table,field);
    this_03 = reflection::Enum::values(this_00);
    pcVar2 = (char *)(ulong)key;
    this_04 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::
              LookupByKey<unsigned_char>(this_03,key);
    this_05 = reflection::Schema::objects(schema);
    pTVar1 = reflection::EnumVal::union_type(this_04);
    pcVar2 = reflection::Type::index(pTVar1,pcVar2,__c_00);
    pOVar3 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                       (this_05,(uint)pcVar2);
    return pOVar3;
  }
  __assert_fail("type_field",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                ,0x1ac,
                "const reflection::Object &flatbuffers::GetUnionType(const reflection::Schema &, const reflection::Object &, const reflection::Field &, const Table &)"
               );
}

Assistant:

inline const reflection::Object &GetUnionType(
    const reflection::Schema &schema, const reflection::Object &parent,
    const reflection::Field &unionfield, const Table &table) {
  auto enumdef = schema.enums()->Get(unionfield.type()->index());
  // TODO: this is clumsy and slow, but no other way to find it?
  auto type_field = parent.fields()->LookupByKey(
      (unionfield.name()->str() + UnionTypeFieldSuffix()).c_str());
  FLATBUFFERS_ASSERT(type_field);
  auto union_type = GetFieldI<uint8_t>(table, *type_field);
  auto enumval = enumdef->values()->LookupByKey(union_type);
  return *schema.objects()->Get(enumval->union_type()->index());
}